

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_fma.cpp
# Opt level: O2

int ncnn::binary_op_2_3_4_20<ncnn::BinaryOp_x86_fma_functor::binary_op_add>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  float fVar1;
  uint uVar2;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  void *pvVar6;
  size_t sVar7;
  size_t sVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  ulong uVar16;
  int iVar17;
  long lVar18;
  undefined1 (*pauVar19) [16];
  int iVar20;
  float *pfVar21;
  ulong uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  
  uVar2 = b->c;
  iVar17 = b->h * b->w * b->d * b->elempack;
  Mat::create_like(c,b,opt->blob_allocator);
  iVar20 = -100;
  if ((c->data != (void *)0x0) && ((long)c->c * c->cstep != 0)) {
    uVar22 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar22 = 0;
    }
    for (uVar16 = 0; uVar16 != uVar22; uVar16 = uVar16 + 1) {
      fVar1 = *a->data;
      auVar23._4_4_ = fVar1;
      auVar23._0_4_ = fVar1;
      auVar23._8_4_ = fVar1;
      auVar23._12_4_ = fVar1;
      pvVar3 = b->data;
      sVar4 = b->elemsize;
      sVar5 = b->cstep;
      pfVar21 = (float *)(sVar5 * uVar16 * sVar4 + (long)pvVar3);
      pvVar6 = c->data;
      sVar7 = c->elemsize;
      sVar8 = c->cstep;
      pauVar19 = (undefined1 (*) [16])(sVar8 * uVar16 * sVar7 + (long)pvVar6);
      lVar18 = 0;
      for (iVar20 = 0; iVar20 + 7 < iVar17; iVar20 = iVar20 + 8) {
        fVar9 = pfVar21[1];
        fVar10 = pfVar21[2];
        fVar11 = pfVar21[3];
        fVar12 = pfVar21[4];
        fVar13 = pfVar21[5];
        fVar14 = pfVar21[6];
        fVar15 = pfVar21[7];
        *(float *)*pauVar19 = fVar1 + *pfVar21;
        *(float *)((long)*pauVar19 + 4) = fVar1 + fVar9;
        *(float *)((long)*pauVar19 + 8) = fVar1 + fVar10;
        *(float *)((long)*pauVar19 + 0xc) = fVar1 + fVar11;
        *(float *)pauVar19[1] = fVar1 + fVar12;
        *(float *)(pauVar19[1] + 4) = fVar1 + fVar13;
        *(float *)(pauVar19[1] + 8) = fVar1 + fVar14;
        *(float *)(pauVar19[1] + 0xc) = fVar1 + fVar15;
        pfVar21 = pfVar21 + 8;
        pauVar19 = pauVar19 + 2;
        lVar18 = lVar18 + 8;
      }
      auVar23 = vshufps_avx(auVar23,auVar23,0);
      for (; iVar20 + 3 < iVar17; iVar20 = iVar20 + 4) {
        auVar24._0_4_ = auVar23._0_4_ + *pfVar21;
        auVar24._4_4_ = auVar23._4_4_ + pfVar21[1];
        auVar24._8_4_ = auVar23._8_4_ + pfVar21[2];
        auVar24._12_4_ = auVar23._12_4_ + pfVar21[3];
        *pauVar19 = auVar24;
        pfVar21 = pfVar21 + 4;
        pauVar19 = pauVar19 + 1;
        lVar18 = lVar18 + 4;
      }
      for (; (int)lVar18 < iVar17; lVar18 = lVar18 + 1) {
        *(float *)((long)pvVar6 + lVar18 * 4 + sVar8 * sVar7 * uVar16) =
             fVar1 + *(float *)((long)pvVar3 + lVar18 * 4 + sVar5 * sVar4 * uVar16);
      }
    }
    iVar20 = 0;
  }
  return iVar20;
}

Assistant:

static int binary_op_2_3_4_20(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = b.w;
    int h = b.h;
    int d = b.d;
    int channels = b.c;
    int elempack = b.elempack;
    int size = w * h * d * elempack;

    // type 2 3 4 20
    c.create_like(b, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float a0 = a[0];
        const float* ptr = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _a0_avx512 = _mm512_set1_ps(a0);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _outp = op.func_pack16(_a0_avx512, _p);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        __m256 _a0_avx = _mm256_set1_ps(a0);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = op.func_pack8(_a0_avx, _p);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        __m128 _a0 = _mm_set1_ps(a0);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _outp = op.func_pack4(_a0, _p);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(a0, *ptr);
            ptr += 1;
            outptr += 1;
        }
    }

    return 0;
}